

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O2

bool __thiscall lzham::search_accelerator::find_all_matches(search_accelerator *this,uint num_bytes)

{
  uint uVar1;
  vector<unsigned_int> *pvVar2;
  byte bVar3;
  uchar *puVar4;
  bool bVar5;
  uint uVar6;
  uint32 uVar7;
  uint uVar8;
  uint uVar9;
  void *pData_ptr;
  uint64 data;
  uint i;
  ulong uVar10;
  vector<unsigned_int> *this_00;
  byte *pbVar11;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  bVar5 = vector<lzham::dict_match>::try_resize_no_construct
                    (&this->m_matches,this->m_max_probes * num_bytes,false);
  if (!bVar5) {
    return false;
  }
  bVar5 = vector<long>::try_resize_no_construct(&this->m_match_refs,num_bytes,false);
  if (!bVar5) {
    return false;
  }
  data = 0xff;
  memset((this->m_match_refs).m_p,0xff,(ulong)((this->m_match_refs).m_size << 3));
  this->m_fill_lookahead_pos = this->m_lookahead_pos;
  this->m_fill_lookahead_size = num_bytes;
  this->m_fill_dict_size = this->m_cur_dict_size;
  this->m_next_match_ref = 0;
  if (((this->m_pTask_pool == (task_pool *)0x0) || (num_bytes < 0x400)) ||
     (this->m_max_helper_threads == 0)) {
    find_all_matches_callback_st(this,data,pData_ptr);
    this->m_num_completed_helper_threads = 0;
  }
  else {
    uVar1 = num_bytes - 2;
    for (uVar6 = uVar1; uVar6 < num_bytes; uVar6 = uVar6 + 1) {
      uVar8 = this->m_fill_lookahead_pos + uVar6;
      uVar9 = this->m_max_dict_size_mask & uVar8;
      (this->m_nodes).m_p[uVar9].m_left = 0;
      (this->m_nodes).m_p[uVar9].m_right = 0;
      (this->m_match_refs).m_p[uVar8 - this->m_fill_lookahead_pos] = -2;
    }
    pvVar2 = this->m_thread_dict_offsets;
    this_00 = pvVar2;
    for (uVar10 = 0; uVar6 = this->m_max_helper_threads, uVar10 < uVar6; uVar10 = uVar10 + 1) {
      vector<unsigned_int>::try_resize(this_00,0,false);
      this_00 = this_00 + 1;
    }
    uVar10 = (ulong)(this->m_max_dict_size_mask & this->m_lookahead_pos);
    puVar4 = (this->m_dict).m_p;
    if (this->m_hash24 == false) {
      pbVar11 = puVar4 + uVar10 + 2;
      uVar6 = (uint)puVar4[uVar10 + 1];
      uVar8 = (uint)puVar4[uVar10];
      for (local_3c = 0; uVar9 = uVar6, local_3c < uVar1; local_3c = local_3c + 1) {
        bVar3 = *pbVar11;
        uVar7 = bitmix32((uint)bVar3 << 4 ^ (uVar9 << 8 | uVar8));
        bVar5 = vector<unsigned_int>::try_push_back
                          (pvVar2 + (ulong)uVar7 % (ulong)this->m_max_helper_threads,&local_3c);
        if (!bVar5) {
          return false;
        }
        pbVar11 = pbVar11 + 1;
        uVar6 = (uint)bVar3;
        uVar8 = uVar9;
      }
    }
    else {
      uVar8 = (uint)puVar4[uVar10 + 1] << 0x10 | (uint)puVar4[uVar10] << 8;
      uVar9 = uVar6 - 1;
      if (uVar9 < (uVar6 ^ uVar9)) {
        pbVar11 = puVar4 + uVar10 + 2;
        for (local_34 = 0; local_34 < uVar1; local_34 = local_34 + 1) {
          uVar8 = (uint)*pbVar11 << 0x10 | uVar8 >> 8;
          uVar7 = bitmix32(uVar8);
          bVar5 = vector<unsigned_int>::try_push_back(pvVar2 + (uVar7 & uVar9),&local_34);
          if (!bVar5) {
            return false;
          }
          pbVar11 = pbVar11 + 1;
        }
      }
      else {
        pbVar11 = puVar4 + uVar10 + 2;
        for (local_38 = 0; local_38 < uVar1; local_38 = local_38 + 1) {
          uVar8 = (uint)*pbVar11 << 0x10 | uVar8 >> 8;
          uVar7 = bitmix32(uVar8);
          bVar5 = vector<unsigned_int>::try_push_back
                            (pvVar2 + (ulong)uVar7 % (ulong)this->m_max_helper_threads,&local_38);
          if (!bVar5) {
            return false;
          }
          pbVar11 = pbVar11 + 1;
        }
      }
    }
    this->m_num_completed_helper_threads = 0;
    bVar5 = task_pool::
            queue_multiple_object_tasks<lzham::search_accelerator,void(lzham::search_accelerator::*)(unsigned_long_long,void*)>
                      (this->m_pTask_pool,this,
                       (offset_in_search_accelerator_to_subr)find_all_matches_callback_mt,0,0,
                       (void *)(ulong)this->m_max_helper_threads);
    if (!bVar5) {
      return false;
    }
  }
  if (this->m_len2_matches == true) {
    bVar5 = find_len2_matches(this);
    return bVar5;
  }
  return true;
}

Assistant:

bool search_accelerator::find_all_matches(uint num_bytes)
   {
      if (!m_matches.try_resize_no_construct(m_max_probes * num_bytes))
      {
         LZHAM_LOG_ERROR(9006);
         return false;
      }

      if (!m_match_refs.try_resize_no_construct(num_bytes))
      {
         LZHAM_LOG_ERROR(9007);
         return false;
      }

      memset(m_match_refs.get_ptr(), 0xFF, m_match_refs.size_in_bytes());

      m_fill_lookahead_pos = m_lookahead_pos;
      m_fill_lookahead_size = num_bytes;
      m_fill_dict_size = m_cur_dict_size;

      m_next_match_ref = 0;

      if ((!m_pTask_pool) || (m_max_helper_threads < 1) || (num_bytes < 1024))
      {
         find_all_matches_callback_st(0, NULL);
         
         m_num_completed_helper_threads = 0;
      }
      else
      {
         for (uint i = num_bytes - 2; i < num_bytes; i++)
         {
            uint fill_lookahead_pos = m_fill_lookahead_pos + i;
            uint insert_pos = fill_lookahead_pos & m_max_dict_size_mask;
            m_nodes[insert_pos].m_left = 0;
            m_nodes[insert_pos].m_right = 0;

            m_match_refs[static_cast<uint>(fill_lookahead_pos - m_fill_lookahead_pos)] = -2;
         }

         for (uint i = 0; i < m_max_helper_threads; i++)
            m_thread_dict_offsets[i].try_resize(0);

         uint bytes_to_add = num_bytes - 2;

         scoped_perf_section sect(cVarArgs, "****** find_all_matches_prep %u", bytes_to_add);
                       
         const uint8* pDict = &m_dict[m_lookahead_pos & m_max_dict_size_mask];
                     
         if (m_hash24)
         {
            uint t = (pDict[0] << 8) | (pDict[1] << 16);

            if (math::is_power_of_2(m_max_helper_threads))
            {
               const uint bitmask = (m_max_helper_threads - 1);
               for (uint i = 0; i < bytes_to_add; i++)
               {
                  t = (t >> 8) | (pDict[2] << 16);

                  LZHAM_ASSERT(t == LZHAM_HASH3_24(pDict[0], pDict[1], pDict[2]));

                  uint thread_index = bitmix32(t) & bitmask;

                  if (!m_thread_dict_offsets[thread_index].try_push_back(i))
                  {
                     LZHAM_LOG_ERROR(9008);
                     return false;
                  }

                  pDict++;
               }
            }
            else
            {
               for (uint i = 0; i < bytes_to_add; i++)
               {
                  t = (t >> 8) | (pDict[2] << 16);

                  LZHAM_ASSERT(t == LZHAM_HASH3_24(pDict[0], pDict[1], pDict[2]));

                  uint thread_index = bitmix32(t) % m_max_helper_threads;

                  if (!m_thread_dict_offsets[thread_index].try_push_back(i))
                  {
                     LZHAM_LOG_ERROR(9009);
                     return false;
                  }

                  pDict++;
               }
            }
         }
         else
         {
            uint c0 = pDict[0];
            uint c1 = pDict[1];
                  
            for (uint i = 0; i < bytes_to_add; i++)
            {
               uint c2 = pDict[2];
               
               uint t = LZHAM_HASH3_16(c0, c1, c2);

               c0 = c1;
               c1 = c2;
                                                            
               uint thread_index = bitmix32(t) % m_max_helper_threads;

               if (!m_thread_dict_offsets[thread_index].try_push_back(i))
               {
                  LZHAM_LOG_ERROR(9010);
                  return false;
               }
               
               pDict++;
            }
         }
         
         m_num_completed_helper_threads = 0;
         
         if (!m_pTask_pool->queue_multiple_object_tasks(this, &search_accelerator::find_all_matches_callback_mt, 0, m_max_helper_threads))
         {
            LZHAM_LOG_ERROR(9011);
            return false;
         }
      }

      return m_len2_matches ? find_len2_matches() : true;
   }